

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ScopedMessage::~ScopedMessage(ScopedMessage *this)

{
  bool bVar1;
  long in_RDI;
  MessageInfo *in_stack_ffffffffffffffe0;
  
  bVar1 = uncaught_exceptions();
  if ((!bVar1) && ((*(byte *)(in_RDI + 0x50) & 1) == 0)) {
    in_stack_ffffffffffffffe0 = (MessageInfo *)getResultCapture();
    (**(_func_int **)((long)(in_stack_ffffffffffffffe0->macroName).m_start + 0x48))
              (in_stack_ffffffffffffffe0,in_RDI);
  }
  MessageInfo::~MessageInfo(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

ScopedMessage::~ScopedMessage() {
        if ( !uncaught_exceptions() && !m_moved ){
            getResultCapture().popScopedMessage(m_info);
        }
    }